

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O0

void __thiscall
Atari::ST::ConcreteMachine::set_display_type(ConcreteMachine *this,DisplayType display_type)

{
  pointer this_00;
  undefined1 local_28 [28];
  DisplayType display_type_local;
  ConcreteMachine *this_local;
  
  local_28._20_4_ = display_type;
  unique0x10000068 = this;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)local_28);
  this_00 = std::
            unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            ::operator->((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          *)local_28);
  ST::Video::set_display_type(this_00,local_28._20_4_);
  std::
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_28);
  return;
}

Assistant:

void set_display_type(Outputs::Display::DisplayType display_type) final {
			video_->set_display_type(display_type);
		}